

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall
singleParticleSpectra::calculate_two_particle_correlation_charge_dep
          (singleParticleSpectra *this,vector<double,_std::allocator<double>_> *event_Qn_p_real,
          vector<double,_std::allocator<double>_> *event_Qn_p_imag,
          vector<double,_std::allocator<double>_> *event_Qn_m_real,
          vector<double,_std::allocator<double>_> *event_Qn_m_imag,
          vector<double,_std::allocator<double>_> *corr_ss,
          vector<double,_std::allocator<double>_> *corr_ss_err,
          vector<double,_std::allocator<double>_> *corr_os,
          vector<double,_std::allocator<double>_> *corr_os_err)

{
  double dVar1;
  reference pvVar2;
  vector<double,_std::allocator<double>_> *event_Q1_real;
  vector<double,_std::allocator<double>_> *event_Q2_real;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_R9;
  vector<double,_std::allocator<double>_> *pvVar3;
  vector<double,_std::allocator<double>_> *in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  double local_Cn2_os;
  int i_1;
  vector<double,_std::allocator<double>_> temp_Cn2_os_2_err;
  vector<double,_std::allocator<double>_> temp_Cn2_os_1_err;
  vector<double,_std::allocator<double>_> temp_Cn2_os_2;
  vector<double,_std::allocator<double>_> temp_Cn2_os_1;
  double local_Cn2_ss;
  int i;
  vector<double,_std::allocator<double>_> temp_Cn2_ss_2_err;
  vector<double,_std::allocator<double>_> temp_Cn2_ss_1_err;
  vector<double,_std::allocator<double>_> temp_Cn2_ss_2;
  vector<double,_std::allocator<double>_> temp_Cn2_ss_1;
  allocator_type *in_stack_fffffffffffffda8;
  value_type vVar4;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdb0;
  size_type in_stack_fffffffffffffdb8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdc0;
  vector<double,_std::allocator<double>_> *pvVar5;
  undefined8 in_stack_fffffffffffffdd8;
  int iVar6;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffde0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffde8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdf0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdf8;
  singleParticleSpectra *in_stack_fffffffffffffe00;
  singleParticleSpectra *this_00;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe10;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe18;
  int local_188;
  vector<double,_std::allocator<double>_> local_159;
  undefined1 local_131 [40];
  undefined1 local_109 [33];
  vector<double,_std::allocator<double>_> *local_e8;
  int local_e0;
  undefined8 local_d8;
  undefined8 local_b0;
  undefined8 local_88;
  vector<double,_std::allocator<double>_> local_80 [2];
  undefined8 local_50;
  vector<double,_std::allocator<double>_> local_48;
  vector<double,_std::allocator<double>_> *local_30;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  local_50 = 0;
  local_30 = in_R9;
  std::allocator<double>::allocator((allocator<double> *)0x16aabf);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (value_type *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::allocator<double>::~allocator((allocator<double> *)0x16aaf3);
  local_88 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16ab2b);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (value_type *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::allocator<double>::~allocator((allocator<double> *)0x16ab5f);
  local_b0 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16ab97);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (value_type *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::allocator<double>::~allocator((allocator<double> *)0x16abcb);
  local_d8 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16ac03);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (value_type *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::allocator<double>::~allocator((allocator<double> *)0x16ac37);
  calculate_two_particle_correlation_charge_base
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,iVar6,in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe18);
  calculate_two_particle_correlation_charge_base
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,iVar6,in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe18);
  for (local_e0 = 0; local_e0 < *(int *)(in_RDI + 0x1c8); local_e0 = local_e0 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,(long)local_e0);
    dVar1 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_80,(long)local_e0);
    in_stack_fffffffffffffe10 = (vector<double,_std::allocator<double>_> *)(dVar1 + *pvVar2);
    local_e8 = in_stack_fffffffffffffe10;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_e0);
    pvVar5 = local_e8;
    *pvVar2 = (double)in_stack_fffffffffffffe10 + *pvVar2;
    in_stack_fffffffffffffe18 = local_e8;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000008,(long)local_e0);
    *pvVar2 = (double)in_stack_fffffffffffffe18 * (double)pvVar5 + *pvVar2;
  }
  event_Q1_real = (vector<double,_std::allocator<double>_> *)(long)*(int *)(in_RDI + 0x1c8);
  local_109._1_8_ = 0;
  this_00 = (singleParticleSpectra *)local_109;
  std::allocator<double>::allocator((allocator<double> *)0x16aeae);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (value_type *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::allocator<double>::~allocator((allocator<double> *)0x16aedc);
  event_Q2_real = (vector<double,_std::allocator<double>_> *)(long)*(int *)(in_RDI + 0x1c8);
  local_131._1_8_ = 0;
  pvVar5 = (vector<double,_std::allocator<double>_> *)local_131;
  std::allocator<double>::allocator((allocator<double> *)0x16af0e);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (value_type *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::allocator<double>::~allocator((allocator<double> *)0x16af3c);
  iVar6 = *(int *)(in_RDI + 0x1c8) >> 0x1f;
  local_159.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _1_8_ = 0;
  pvVar3 = &local_159;
  std::allocator<double>::allocator((allocator<double> *)0x16af6e);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (value_type *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::allocator<double>::~allocator((allocator<double> *)0x16af9c);
  std::allocator<double>::allocator((allocator<double> *)0x16afce);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (value_type *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::allocator<double>::~allocator((allocator<double> *)0x16affc);
  calculate_two_particle_correlation_charge_base
            (this_00,event_Q1_real,pvVar5,event_Q2_real,pvVar3,iVar6,in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe18);
  calculate_two_particle_correlation_charge_base
            (this_00,event_Q1_real,pvVar5,event_Q2_real,pvVar3,iVar6,in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe18);
  for (local_188 = 0; local_188 < *(int *)(in_RDI + 0x1c8); local_188 = local_188 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_109 + 9),(long)local_188);
    vVar4 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_131 + 9),(long)local_188);
    pvVar3 = (vector<double,_std::allocator<double>_> *)(vVar4 + *pvVar2);
    in_stack_fffffffffffffdb0 = pvVar3;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000010,(long)local_188);
    *pvVar2 = (double)in_stack_fffffffffffffdb0 + *pvVar2;
    pvVar5 = pvVar3;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000018,(long)local_188);
    *pvVar2 = (double)pvVar3 * (double)pvVar5 + *pvVar2;
  }
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffdb0);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffdb0);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffdb0);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffdb0);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffdb0);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffdb0);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffdb0);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffdb0);
  return;
}

Assistant:

void singleParticleSpectra::calculate_two_particle_correlation_charge_dep(
    vector<double> &event_Qn_p_real, vector<double> &event_Qn_p_imag,
    vector<double> &event_Qn_m_real, vector<double> &event_Qn_m_imag,
    vector<double> &corr_ss, vector<double> &corr_ss_err,
    vector<double> &corr_os, vector<double> &corr_os_err) {
    vector<double> temp_Cn2_ss_1(order_max, 0.);
    vector<double> temp_Cn2_ss_2(order_max, 0.);
    vector<double> temp_Cn2_ss_1_err(order_max, 0.);
    vector<double> temp_Cn2_ss_2_err(order_max, 0.);
    calculate_two_particle_correlation_charge_base(
        event_Qn_p_real, event_Qn_p_imag, event_Qn_p_real, event_Qn_p_imag, 0,
        temp_Cn2_ss_1, temp_Cn2_ss_1_err);
    calculate_two_particle_correlation_charge_base(
        event_Qn_m_real, event_Qn_m_imag, event_Qn_m_real, event_Qn_m_imag, 0,
        temp_Cn2_ss_2, temp_Cn2_ss_2_err);
    for (int i = 0; i < order_max; i++) {
        double local_Cn2_ss = temp_Cn2_ss_1[i] + temp_Cn2_ss_2[i];
        corr_ss[i] += local_Cn2_ss;
        corr_ss_err[i] += local_Cn2_ss * local_Cn2_ss;
    }

    vector<double> temp_Cn2_os_1(order_max, 0.);
    vector<double> temp_Cn2_os_2(order_max, 0.);
    vector<double> temp_Cn2_os_1_err(order_max, 0.);
    vector<double> temp_Cn2_os_2_err(order_max, 0.);
    calculate_two_particle_correlation_charge_base(
        event_Qn_p_real, event_Qn_p_imag, event_Qn_m_real, event_Qn_m_imag, 1,
        temp_Cn2_os_1, temp_Cn2_os_1_err);
    calculate_two_particle_correlation_charge_base(
        event_Qn_m_real, event_Qn_m_imag, event_Qn_p_real, event_Qn_p_imag, 1,
        temp_Cn2_os_2, temp_Cn2_os_2_err);
    for (int i = 0; i < order_max; i++) {
        double local_Cn2_os = temp_Cn2_os_1[i] + temp_Cn2_os_2[i];
        corr_os[i] += local_Cn2_os;
        corr_os_err[i] += local_Cn2_os * local_Cn2_os;
    }
}